

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<DataStream,int,unsigned_int,CKeyID>
               (DataStream *s,int *args,uint *args_1,CKeyID *args_2)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata32<DataStream>(s,*args);
  ser_writedata32<DataStream>(s,*args_1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    base_blob<160U>::Serialize<DataStream>((base_blob<160U> *)args_2,s);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}